

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCommandBuffersTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_0::createPoolNonNullAllocatorTest
          (TestStatus *__return_storage_ptr__,Context *context)

{
  deUint32 dVar1;
  VkDevice device;
  DeviceInterface *vk_00;
  allocator<char> local_91;
  string local_90;
  Move<vk::Handle<(vk::HandleType)24>_> local_70;
  undefined1 local_50 [8];
  VkCommandPoolCreateInfo cmdPoolParams;
  VkAllocationCallbacks *allocationCallbacks;
  deUint32 queueFamilyIndex;
  DeviceInterface *vk;
  VkDevice vkDevice;
  Context *context_local;
  
  device = Context::getDevice(context);
  vk_00 = Context::getDeviceInterface(context);
  dVar1 = Context::getUniversalQueueFamilyIndex(context);
  cmdPoolParams._16_8_ = ::vk::getSystemAllocator();
  local_50._0_4_ = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
  cmdPoolParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  cmdPoolParams._4_4_ = 0;
  cmdPoolParams.pNext._0_4_ = 0;
  cmdPoolParams.pNext._4_4_ = dVar1;
  ::vk::createCommandPool
            (&local_70,vk_00,device,(VkCommandPoolCreateInfo *)local_50,
             (VkAllocationCallbacks *)cmdPoolParams._16_8_);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move(&local_70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"Command Pool allocated correctly.",&local_91);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createPoolNonNullAllocatorTest(Context& context)
{
	const VkDevice							vkDevice				= context.getDevice();
	const DeviceInterface&					vk						= context.getDeviceInterface();
	const deUint32							queueFamilyIndex		= context.getUniversalQueueFamilyIndex();
	const VkAllocationCallbacks*			allocationCallbacks		= getSystemAllocator();

	const VkCommandPoolCreateInfo			cmdPoolParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,					// sType;
		DE_NULL,													// pNext;
		0u,															// flags;
		queueFamilyIndex,											// queueFamilyIndex;
	};

	createCommandPool(vk, vkDevice, &cmdPoolParams, allocationCallbacks);

	return tcu::TestStatus::pass("Command Pool allocated correctly.");
}